

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t gc_onestep(lua_State *L)

{
  GCSize *pGVar1;
  BloomFilter *pBVar2;
  cTValue *o;
  size_t *psVar3;
  uint uVar4;
  GCSize GVar5;
  uint32_t uVar6;
  uint uVar7;
  BloomFilter BVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  GCRef *pGVar13;
  size_t sVar14;
  size_t sVar15;
  global_State *g;
  GCtab *t;
  MSize MVar16;
  GCobj *pGVar17;
  GCstr *s;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  undefined1 *puVar22;
  GCstr *pGVar23;
  int local_40;
  long lVar21;
  
  uVar4 = (L->glref).ptr32;
  g = (global_State *)(ulong)uVar4;
  uVar12 = (ulong)(g->gc).state;
  psVar3 = (g->gc).state_count + uVar12;
  *psVar3 = *psVar3 + 1;
  switch(uVar12) {
  case 0:
    (g->gc).gray = 0;
    (g->gc).grayagain = 0;
    (g->gc).weak.gcptr32 = 0;
    pGVar17 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    if (((pGVar17->gch).marked & 3) != 0) {
      gc_mark(g,pGVar17);
      pGVar17 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    }
    if (((((GCobj *)(ulong)(uint)(pGVar17->pt).firstline)->gch).marked & 3) != 0) {
      gc_mark(g,(GCobj *)(ulong)(uint)(pGVar17->pt).firstline);
    }
    if (((g->registrytv).field_2.it + 0xd < 9) &&
       (pGVar17 = (GCobj *)(ulong)(g->registrytv).u32.lo, ((pGVar17->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar17);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case 1:
    if ((g->gc).gray.gcptr32 != 0) {
      sVar14 = propagatemark(g);
      return sVar14;
    }
    (g->gc).state = '\x02';
    break;
  case 2:
    if ((g->jit_base).ptr32 != 0) {
      return 0x7fffff00;
    }
    uVar10 = (g->uvhead).field_5.field_1.next.gcptr32;
    while (puVar22 = (undefined1 *)(ulong)uVar10, &g->uvhead != (GCupval *)puVar22) {
      if ((((puVar22[4] & 7) == 0) && (((uint *)(ulong)*(uint *)(puVar22 + 0x10))[1] + 0xd < 9)) &&
         (pGVar17 = (GCobj *)(ulong)*(uint *)(ulong)*(uint *)(puVar22 + 0x10),
         ((pGVar17->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar17);
      }
      uVar10 = *(uint *)(puVar22 + 0xc);
    }
    while ((g->gc).gray.gcptr32 != 0) {
      propagatemark(g);
    }
    (g->gc).gray.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    while ((g->gc).gray.gcptr32 != 0) {
      propagatemark(g);
    }
    uVar6 = (g->gc).grayagain.gcptr32;
    (g->gc).gray.gcptr32 = uVar6;
    (g->gc).grayagain.gcptr32 = 0;
    while (uVar6 != 0) {
      propagatemark(g);
      uVar6 = (g->gc).gray.gcptr32;
    }
    sVar14 = lj_gc_separateudata(g,0);
    uVar10 = (g->gc).mmudata.gcptr32;
    pGVar17 = (GCobj *)(ulong)uVar10;
    if (pGVar17 != (GCobj *)0x0) {
      do {
        uVar7 = (pGVar17->gch).nextgc.gcptr32;
        pGVar17 = (GCobj *)(ulong)uVar7;
        (pGVar17->gch).marked = (g->gc).currentwhite & 3 | (pGVar17->gch).marked & 0xf8;
        gc_mark(g,pGVar17);
      } while (uVar7 != uVar10);
    }
    if ((g->gc).gray.gcptr32 == 0) {
      iVar20 = 0;
    }
    else {
      lVar21 = 0;
      do {
        sVar15 = propagatemark(g);
        lVar21 = lVar21 + sVar15;
        iVar20 = (int)lVar21;
      } while ((g->gc).gray.gcptr32 != 0);
    }
    uVar10 = (g->gc).weak.gcptr32;
    while (uVar10 != 0) {
      uVar12 = (ulong)uVar10;
      if (((*(byte *)(uVar12 + 4) & 0x10) != 0) &&
         (uVar10 = *(uint *)(uVar12 + 0x18), (ulong)uVar10 != 0)) {
        lVar21 = 0;
        do {
          uVar7 = *(uint *)(uVar12 + 8);
          iVar11 = gc_mayclear((cTValue *)((ulong)uVar7 + lVar21),1);
          if (iVar11 != 0) {
            *(undefined4 *)((ulong)uVar7 + 4 + lVar21) = 0xffffffff;
          }
          lVar21 = lVar21 + 8;
        } while ((ulong)uVar10 << 3 != lVar21);
      }
      uVar10 = *(uint *)(uVar12 + 0x1c);
      if (uVar10 != 0) {
        uVar7 = *(uint *)(uVar12 + 0x14);
        uVar19 = 0;
        do {
          if (*(int *)((ulong)uVar7 + 4 + uVar19 * 0x18) != -1) {
            o = (cTValue *)((ulong)uVar7 + uVar19 * 0x18);
            if (*(int *)((long)o + 0xc) + 0xdU < 9) {
              bVar9 = *(byte *)((ulong)o[1].u32.lo + 4);
              if (*(int *)((long)o + 0xc) == -5) {
                *(byte *)((ulong)o[1].u32.lo + 4) = bVar9 & 0xfc;
                goto LAB_0011063f;
              }
              if ((bVar9 & 3) == 0) goto LAB_0011063f;
            }
            else {
LAB_0011063f:
              iVar11 = gc_mayclear(o,1);
              if (iVar11 == 0) goto LAB_00110659;
            }
            (o->field_2).it = 0xffffffff;
          }
LAB_00110659:
          uVar18 = (int)uVar19 + 1;
          uVar19 = (ulong)uVar18;
        } while (uVar18 <= uVar10);
      }
      uVar10 = *(uint *)(uVar12 + 0xc);
    }
    local_40 = (int)sVar14;
    lj_buf_shrink(L,&g->tmpbuf);
    bVar9 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar9;
    (g->strempty).marked = bVar9;
    (g->gc).sweep.ptr32 = uVar4 + 0x60;
    (g->gc).estimate = (g->gc).total - (iVar20 + local_40);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    (g->strbloom).next[0] = 0;
    (g->strbloom).next[1] = 0;
    break;
  case 3:
    GVar5 = (g->gc).total;
    pGVar13 = g->strhash;
    uVar4 = (g->gc).sweepstr;
    MVar16 = uVar4 + 1;
    (g->gc).sweepstr = MVar16;
    uVar10 = pGVar13[uVar4].gcptr32;
    if (uVar10 != 0) {
      pGVar23 = (GCstr *)(pGVar13 + uVar4);
      bVar9 = (g->gc).currentwhite;
      do {
        s = (GCstr *)(ulong)uVar10;
        if ((byte)((s->marked ^ 3) & (bVar9 ^ 3)) == 0) {
          (pGVar23->nextgc).gcptr32 = (s->nextgc).gcptr32;
          lj_str_free(g,s);
        }
        else {
          s->marked = (g->gc).currentwhite & 3 | s->marked & 0xf8;
          pGVar23 = s;
          if (0xbf < s->strflags) {
            pBVar2 = (g->strbloom).next;
            *pBVar2 = *pBVar2 | 1L << (byte)(s->hash >> 0x1a);
            pBVar2 = (g->strbloom).next + 1;
            *pBVar2 = *pBVar2 | 1L << (s->strflags & 0x3f);
          }
        }
        uVar10 = (pGVar23->nextgc).gcptr32;
      } while (uVar10 != 0);
      MVar16 = (g->gc).sweepstr;
    }
    if (g->strmask < MVar16) {
      (g->gc).state = '\x04';
      BVar8 = (g->strbloom).next[1];
      (g->strbloom).cur[0] = (g->strbloom).next[0];
      (g->strbloom).cur[1] = BVar8;
    }
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar5);
    return 10;
  case 4:
    GVar5 = (g->gc).total;
    pGVar13 = gc_sweep(g,(GCRef *)(ulong)(g->gc).sweep.ptr32,0x28);
    (g->gc).sweep.ptr32 = (uint32_t)pGVar13;
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar5);
    if (*(int *)((ulong)pGVar13 & 0xffffffff) != 0) {
      return 400;
    }
    uVar4 = g->strmask;
    if ((0x1ff < uVar4) && (g->strnum <= uVar4 >> 2)) {
      lj_str_resize(L,uVar4 >> 1);
    }
    if ((g->gc).mmudata.gcptr32 != 0) {
      (g->gc).state = '\x05';
      (g->gc).nocdatafin = '\x01';
      return 400;
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
    return 400;
  case 5:
    if ((g->gc).mmudata.gcptr32 != 0) {
      if ((g->jit_base).ptr32 != 0) {
        return 0x7fffff00;
      }
      gc_finalize(L);
      uVar4 = (g->gc).estimate;
      if (uVar4 < 0x65) {
        return 100;
      }
      (g->gc).estimate = uVar4 - 100;
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      lj_tab_rehash(L,(GCtab *)(ulong)g->gcroot[0x26].gcptr32);
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  g->gc.state_count[g->gc.state]++;
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
#if LUAJIT_SMART_STRINGS
    g->strbloom.next[0] = 0;
    g->strbloom.next[1] = 0;
#endif
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweep_str_chain(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask) {
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
#if LUAJIT_SMART_STRINGS
      g->strbloom.cur[0] = g->strbloom.next[0];
      g->strbloom.cur[1] = g->strbloom.next[1];
#endif
    }
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->strnum <= (g->strmask >> 2) && g->strmask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->strmask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, tabref(g->gcroot[GCROOT_FFI_FIN]));
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}